

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  string *psVar1;
  int iVar2;
  Descriptor *pDVar3;
  FieldGenerator *pFVar4;
  int i_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  ulong uVar5;
  ulong extraout_RDX;
  FieldDescriptor *field;
  int iVar6;
  int i;
  long lVar7;
  java *this_01;
  long lVar8;
  char *pcVar9;
  SubstituteArg *in_stack_fffffffffffffd78;
  MessageGenerator *pMVar10;
  MessageGenerator messageGenerator;
  string local_240;
  string builder_type;
  SubstituteArg local_200;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar3 = this->descriptor_;
  if (*(long *)(pDVar3 + 0x18) == 0) {
    pcVar9 = "static";
    if (*(char *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0x88) + 0x54) != '\0') {
      pcVar9 = "";
    }
  }
  else {
    pcVar9 = "static";
  }
  WriteMessageDocComment(printer,pDVar3);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  iVar6 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  if (*(int *)(this->descriptor_ + 0x58) < 1) {
    if (iVar6 == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite\n    implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      std::__cxx11::string::~string((string *)&messageGenerator);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage\n    implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      std::__cxx11::string::~string((string *)&messageGenerator);
    }
    std::__cxx11::string::assign((char *)&builder_type);
  }
  else {
    if (iVar6 == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      std::__cxx11::string::~string((string *)&messageGenerator);
      ClassName_abi_cxx11_(&local_240,(java *)this->descriptor_,descriptor);
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      messageGenerator.descriptor_ = (Descriptor *)local_240._M_dataplus._M_p;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      messageGenerator.field_generators_.descriptor_._0_4_ = (undefined4)local_240._M_string_length;
      local_1b0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
                 (char *)&messageGenerator,&local_200,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      std::__cxx11::string::~string((string *)&messageGenerator);
      ClassName_abi_cxx11_(&local_240,(java *)this->descriptor_,descriptor_00);
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      messageGenerator.descriptor_ = (Descriptor *)local_240._M_dataplus._M_p;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      messageGenerator.field_generators_.descriptor_._0_4_ = (undefined4)local_240._M_string_length;
      local_1b0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
                 (char *)&messageGenerator,&local_200,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
    }
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_240);
  }
  io::Printer::Indent(printer);
  psVar1 = *(string **)this->descriptor_;
  pcVar9 = "  this.unknownFields = builder.getUnknownFields();";
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    pcVar9 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n$set_unknown_fields$\n}\n"
                     ,"classname",psVar1,"buildertype",&builder_type,"set_unknown_fields",
                     (string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  psVar1 = *(string **)this->descriptor_;
  pcVar9 = " this.unknownFields = com.google.protobuf.UnknownFieldSet.getDefaultInstance(); ";
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    pcVar9 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,pcVar9,(allocator<char> *)&local_200);
  io::Printer::Print(printer,
                     "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n\nprivate static final $classname$ defaultInstance;\npublic static $classname$ getDefaultInstance() {\n  return defaultInstance;\n}\n\npublic $classname$ getDefaultInstanceForType() {\n  return defaultInstance;\n}\n\n"
                     ,"classname",psVar1,"set_default_unknown_fields",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "private final com.google.protobuf.UnknownFieldSet unknownFields;\n@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\n    getUnknownFields() {\n  return this.unknownFields;\n}\n"
                      );
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 2)
    goto LAB_001bfefe;
  }
  GenerateParsingConstructor(this,printer);
LAB_001bfefe:
  GenerateDescriptorMethods(this,printer);
  GenerateParser(this,printer);
  lVar8 = 0;
  for (lVar7 = 0; pDVar3 = this->descriptor_, lVar7 < *(int *)(pDVar3 + 0x48); lVar7 = lVar7 + 1) {
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)&messageGenerator,
               (EnumDescriptor *)(*(long *)(pDVar3 + 0x50) + lVar8));
    EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
    lVar8 = lVar8 + 0x38;
  }
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(pDVar3 + 0x38); lVar7 = lVar7 + 1) {
    MessageGenerator(&messageGenerator,(Descriptor *)(*(long *)(pDVar3 + 0x40) + lVar8));
    GenerateInterface(&messageGenerator,printer);
    Generate(&messageGenerator,printer);
    FieldGeneratorMap::~FieldGeneratorMap(&messageGenerator.field_generators_);
    pDVar3 = this->descriptor_;
    lVar8 = lVar8 + 0x78;
  }
  this_00 = &this->field_generators_;
  lVar8 = 0;
  iVar6 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(pDVar3 + 0x2c); lVar7 = lVar7 + 1) {
    pFVar4 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar8));
    iVar2 = (*pFVar4->_vptr_FieldGenerator[2])(pFVar4);
    iVar6 = iVar6 + iVar2;
    pDVar3 = this->descriptor_;
    lVar8 = lVar8 + 0x78;
  }
  iVar2 = (iVar6 + 0x1f) / 0x20;
  uVar5 = (long)(iVar6 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar5);
    io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                       (string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    uVar5 = extraout_RDX;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this->descriptor_ + 0x2c); lVar8 = lVar8 + 1) {
    anon_unknown_5::PrintFieldComment
              (printer,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar7));
    pMVar10 = this;
    FieldConstantName_abi_cxx11_
              ((string *)&messageGenerator,(java *)(*(long *)(this->descriptor_ + 0x30) + lVar7),
               field);
    SimpleItoa_abi_cxx11_
              ((string *)&local_200,
               (protobuf *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x28 + lVar7),i_00
              );
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",(string *)&messageGenerator,"number",(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&messageGenerator);
    pFVar4 = FieldGeneratorMap::get
                       (this_00,(FieldDescriptor *)(*(long *)(pMVar10->descriptor_ + 0x30) + lVar7))
    ;
    (*pFVar4->_vptr_FieldGenerator[5])(pFVar4,printer);
    io::Printer::Print(printer,"\n");
    lVar7 = lVar7 + 0x78;
    this = pMVar10;
  }
  io::Printer::Print(printer,"private void initFields() {\n");
  io::Printer::Indent(printer);
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(this->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    pFVar4 = FieldGeneratorMap::get
                       (this_00,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar8));
    (*pFVar4->_vptr_FieldGenerator[7])(pFVar4,printer);
    lVar8 = lVar8 + 0x78;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  lVar7 = *(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88);
  if (*(int *)(lVar7 + 0x50) != 2) {
    GenerateIsInitialized(this,printer,MEMOIZE);
    GenerateMessageSerializationMethods(this,printer);
    lVar7 = *(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88);
  }
  if (*(char *)(lVar7 + 0x55) == '\x01') {
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  io::Printer::Print(printer,
                     "\nstatic {\n  defaultInstance = new $classname$(true);\n  defaultInstance.initFields();\n}\n\n// @@protoc_insertion_point(class_scope:$full_name$)\n"
                     ,"classname",*(string **)this->descriptor_,"full_name",
                     *(string **)(this->descriptor_ + 8));
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(this->descriptor_ + 0x68); lVar7 = lVar7 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)&messageGenerator,
               (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x70) + lVar8));
    ExtensionGenerator::Generate((ExtensionGenerator *)&messageGenerator,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&messageGenerator);
    lVar8 = lVar8 + 0x78;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::__cxx11::string::~string((string *)&builder_type);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file =
    descriptor_->containing_type() == NULL &&
    descriptor_->file()->options().java_multiple_files();

  WriteMessageDocComment(printer, descriptor_);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
    }
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "$set_unknown_fields$\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type,
    "set_unknown_fields", HasUnknownFields(descriptor_)
        ? "  this.unknownFields = builder.getUnknownFields();" : "");
  printer->Print(
    // Used when constructing the default instance, which cannot be initialized
    // immediately because it may cyclically refer to other default instances.
    "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n"
    "\n"
    "private static final $classname$ defaultInstance;\n"
    "public static $classname$ getDefaultInstance() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n"
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n",
    "classname", descriptor_->name(),
    "set_default_unknown_fields", HasUnknownFields(descriptor_)
        ? " this.unknownFields ="
          " com.google.protobuf.UnknownFieldSet.getDefaultInstance(); " : "");

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "private final com.google.protobuf.UnknownFieldSet unknownFields;\n"
        ""
        "@java.lang.Override\n"
        "public final com.google.protobuf.UnknownFieldSet\n"
        "    getUnknownFields() {\n"
        "  return this.unknownFields;\n"
        "}\n");
  }

  if (HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);
  GenerateParser(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i)).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator messageGenerator(descriptor_->nested_type(i));
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    PrintFieldComment(printer, descriptor_->field(i));
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  // Called by the constructor, except in the case of the default instance,
  // in which case this is called by static init code later on.
  printer->Print("private void initFields() {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateInitializationCode(printer);
  }
  printer->Outdent();
  printer->Print("}\n");

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, MEMOIZE);
    GenerateMessageSerializationMethods(printer);
  }

  if (HasEqualsAndHashCode(descriptor_)) {
    GenerateEqualsAndHashCode(printer);
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "\n"
    "static {\n"
    "  defaultInstance = new $classname$(true);\n"
    "  defaultInstance.initFields();\n"
    "}\n"
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "classname", descriptor_->name(),
    "full_name", descriptor_->full_name());

  // Extensions must be declared after the defaultInstance is initialized
  // because the defaultInstance is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i)).Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}